

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O0

void __thiscall
script_standard_tests::bip341_spk_test_vectors::bip341_spk_test_vectors
          (bip341_spk_test_vectors *this)

{
  long lVar1;
  long in_FS_OFFSET;
  TestOpts *in_stack_00000130;
  ChainType in_stack_0000013c;
  BasicTestingSetup *in_stack_00000140;
  TestOpts *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&in_stack_ffffffffffffffa8->extra_args);
  BasicTestingSetup::BasicTestingSetup(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  TestOpts::~TestOpts(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_spk_test_vectors)
{
    using control_set = decltype(TaprootSpendData::scripts)::mapped_type;

    UniValue tests;
    tests.read(json_tests::bip341_wallet_vectors);

    const auto& vectors = tests["scriptPubKey"];

    for (const auto& vec : vectors.getValues()) {
        TaprootBuilder spktest;
        std::map<std::pair<std::vector<unsigned char>, int>, int> scriptposes;
        std::function<void (const UniValue&, int)> parse_tree = [&](const UniValue& node, int depth) {
            if (node.isNull()) return;
            if (node.isObject()) {
                auto script = ParseHex(node["script"].get_str());
                int idx = node["id"].getInt<int>();
                int leaf_version = node["leafVersion"].getInt<int>();
                scriptposes[{script, leaf_version}] = idx;
                spktest.Add(depth, script, leaf_version);
            } else {
                parse_tree(node[0], depth + 1);
                parse_tree(node[1], depth + 1);
            }
        };
        parse_tree(vec["given"]["scriptTree"], 0);
        spktest.Finalize(XOnlyPubKey(ParseHex(vec["given"]["internalPubkey"].get_str())));
        BOOST_CHECK_EQUAL(HexStr(GetScriptForDestination(spktest.GetOutput())), vec["expected"]["scriptPubKey"].get_str());
        BOOST_CHECK_EQUAL(EncodeDestination(spktest.GetOutput()), vec["expected"]["bip350Address"].get_str());
        auto spend_data = spktest.GetSpendData();
        BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].isNull(), spend_data.merkle_root.IsNull());
        if (!spend_data.merkle_root.IsNull()) {
            BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].get_str(), HexStr(spend_data.merkle_root));
        }
        BOOST_CHECK_EQUAL(spend_data.scripts.size(), scriptposes.size());
        for (const auto& scriptpos : scriptposes) {
            BOOST_CHECK(spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec["expected"]["scriptPathControlBlocks"][scriptpos.second].get_str())});
        }
    }
}